

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  float *pfVar2;
  ImGuiWindow **ppIVar3;
  ImVec2 *pIVar4;
  int *piVar5;
  ImGuiNextWindowData *pIVar6;
  ImS8 *pIVar7;
  bool *pbVar8;
  ImU16 *pIVar9;
  ImGuiID IVar10;
  ImGuiContextHook *pIVar11;
  ImFontAtlas *pIVar12;
  uint *puVar13;
  ImGuiViewportP *pIVar14;
  ImGuiInputEvent *pIVar15;
  ImGuiTableTempData *pIVar16;
  ImGuiWindowStackData *pIVar17;
  ImGuiPopupData *pIVar18;
  int *piVar19;
  ImGuiGroupData *pIVar20;
  ImGuiStackLevelInfo *pIVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  ImVec2 IVar24;
  ImVec2 IVar25;
  ImVec2 IVar26;
  ImVec2 IVar27;
  ImVec2 IVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  ImGuiContext *pIVar31;
  ImGuiContext *pIVar32;
  ImGuiContext *pIVar33;
  undefined3 uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  int iVar38;
  ImGuiContext *g_7;
  ImGuiContext *pIVar39;
  ImGuiKeyData *pIVar40;
  ImGuiWindow *pIVar41;
  ImGuiWindowStackData *__dest;
  ImGuiPopupData *__dest_00;
  int *piVar42;
  ImGuiGroupData *__dest_01;
  ImGuiStackLevelInfo *__dest_02;
  int i;
  uint uVar43;
  ImGuiScrollFlags scroll_flags;
  ulong uVar44;
  ImGuiWindow *window;
  char *pcVar45;
  ImGuiWindow *parent;
  long lVar46;
  ImGuiWindow *pIVar47;
  ImGuiContext *g;
  int iVar48;
  ImGuiID IVar49;
  uint uVar50;
  float *pfVar51;
  ImGuiNavLayer IVar52;
  ImFont *font;
  float *pfVar53;
  ImGuiContext *g_1;
  byte bVar54;
  ImGuiWindow *old_nav_window;
  undefined4 uVar55;
  ImGuiContext *g_2;
  long lVar56;
  ImGuiContext *ctx;
  long lVar57;
  long lVar58;
  ulong uVar59;
  bool bVar60;
  byte bVar61;
  float fVar62;
  float fVar63;
  float scale;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  ImVec2 IVar69;
  ImVec2 IVar70;
  float fVar71;
  float fVar72;
  ImRect local_98;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar31 = GImGui;
  bVar61 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x10ba,"void ImGui::NewFrame()");
  }
  lVar56 = (long)(GImGui->Hooks).Size;
  if (0 < lVar56) {
    lVar57 = -lVar56;
    lVar58 = lVar56 << 5;
    do {
      lVar46 = (long)(pIVar31->Hooks).Size;
      if (lVar46 < lVar56) {
        pcVar45 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_00133048;
      }
      pIVar11 = (pIVar31->Hooks).Data;
      if (*(int *)(pIVar11 + lVar58 + -0x1c) == 7) {
        memmove(pIVar11 + lVar58 + -0x20,pIVar11 + lVar58,(lVar46 + lVar57) * 0x20);
        (pIVar31->Hooks).Size = (pIVar31->Hooks).Size + -1;
      }
      lVar57 = lVar57 + 1;
      bVar60 = 1 < lVar56;
      lVar56 = lVar56 + -1;
      lVar58 = lVar58 + -0x20;
    } while (bVar60);
  }
  if (0 < (pIVar31->Hooks).Size) {
    lVar56 = 0;
    lVar58 = 0;
    do {
      pIVar11 = (pIVar31->Hooks).Data;
      if (*(int *)(pIVar11 + lVar56 + 4) == 0) {
        (**(code **)(pIVar11 + lVar56 + 0x10))(pIVar31);
      }
      lVar58 = lVar58 + 1;
      lVar56 = lVar56 + 0x20;
    } while (lVar58 < (pIVar31->Hooks).Size);
  }
  pIVar39 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f6d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f6e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f6f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f70,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar12 = (GImGui->IO).Fonts;
  if (((pIVar12->Fonts).Size < 1) || ((pIVar12->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f71,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f72,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f73,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar62 = (GImGui->Style).Alpha;
  if ((fVar62 < 0.0) || (1.0 < fVar62)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f74,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f75,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f76,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (1 < (uint)(GImGui->Style).ColorButtonPosition) {
    __assert_fail("g.Style.ColorButtonPosition == ImGuiDir_Left || g.Style.ColorButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f77,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar56 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar56 + 0x200] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ImGuiKey_LegacyNativeKey_END && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1f7a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar56 = lVar56 + 1;
  } while (lVar56 != 0x85);
  if (((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')
      ) && ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x1f7e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar39->SettingsLoaded == false) {
    if ((pIVar39->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x2d75,"void ImGui::UpdateSettings()");
    }
    pcVar45 = (pIVar39->IO).IniFilename;
    if (pcVar45 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar45);
    }
    pIVar39->SettingsLoaded = true;
  }
  if ((0.0 < pIVar39->SettingsDirtyTimer) &&
     (fVar62 = pIVar39->SettingsDirtyTimer - (pIVar39->IO).DeltaTime,
     pIVar39->SettingsDirtyTimer = fVar62, fVar62 <= 0.0)) {
    pcVar45 = (pIVar39->IO).IniFilename;
    if (pcVar45 == (char *)0x0) {
      (pIVar39->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar45);
    }
    pIVar39->SettingsDirtyTimer = 0.0;
  }
  pIVar31->Time = (double)(pIVar31->IO).DeltaTime + pIVar31->Time;
  pIVar31->WithinFrameScope = true;
  pIVar31->FrameCount = pIVar31->FrameCount + 1;
  pIVar31->TooltipOverrideCount = 0;
  pIVar31->WindowsActiveCount = 0;
  iVar48 = (pIVar31->MenusIdSubmittedThisFrame).Capacity;
  if (iVar48 < 0) {
    uVar43 = iVar48 / 2 + iVar48;
    uVar44 = 0;
    if (0 < (int)uVar43) {
      uVar44 = (ulong)uVar43;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    pIVar39 = (ImGuiContext *)(*GImAllocatorAllocFunc)(uVar44 * 4,GImAllocatorUserData);
    puVar13 = (pIVar31->MenusIdSubmittedThisFrame).Data;
    if (puVar13 != (uint *)0x0) {
      memcpy(pIVar39,puVar13,(long)(pIVar31->MenusIdSubmittedThisFrame).Size << 2);
      puVar13 = (pIVar31->MenusIdSubmittedThisFrame).Data;
      if ((puVar13 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar13,GImAllocatorUserData);
    }
    (pIVar31->MenusIdSubmittedThisFrame).Data = (uint *)pIVar39;
    (pIVar31->MenusIdSubmittedThisFrame).Capacity = (int)uVar44;
  }
  (pIVar31->MenusIdSubmittedThisFrame).Size = 0;
  fVar62 = (pIVar31->IO).DeltaTime;
  iVar48 = pIVar31->FramerateSecPerFrameIdx;
  pIVar31->FramerateSecPerFrameAccum =
       (fVar62 - pIVar31->FramerateSecPerFrame[iVar48]) + pIVar31->FramerateSecPerFrameAccum;
  pIVar31->FramerateSecPerFrame[iVar48] = fVar62;
  iVar38 = iVar48 + (int)((ulong)((long)(iVar48 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar31->FramerateSecPerFrameIdx = iVar48 + 1 + ((iVar38 >> 6) - (iVar38 >> 0x1f)) * -0x78;
  iVar48 = 0x77;
  if (pIVar31->FramerateSecPerFrameCount < 0x77) {
    iVar48 = pIVar31->FramerateSecPerFrameCount;
  }
  pIVar31->FramerateSecPerFrameCount = iVar48 + 1;
  uVar43 = -(uint)(0.0 < pIVar31->FramerateSecPerFrameAccum);
  (pIVar31->IO).Framerate =
       (float)(~uVar43 & 0x7f7fffff |
              (uint)(1.0 / (pIVar31->FramerateSecPerFrameAccum / (float)(iVar48 + 1))) & uVar43);
  pIVar33 = GImGui;
  if ((GImGui->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2eba,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar14 = *(GImGui->Viewports).Data;
  (pIVar14->super_ImGuiViewport).Flags = 5;
  (pIVar14->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar14->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar14->super_ImGuiViewport).Size = (pIVar33->IO).DisplaySize;
  if (0 < (pIVar33->Viewports).Size) {
    lVar56 = 0;
    do {
      pIVar14 = (pIVar33->Viewports).Data[lVar56];
      pIVar14->WorkOffsetMin = pIVar14->BuildWorkOffsetMin;
      pIVar14->WorkOffsetMax = pIVar14->BuildWorkOffsetMax;
      (pIVar14->BuildWorkOffsetMin).x = 0.0;
      (pIVar14->BuildWorkOffsetMin).y = 0.0;
      (pIVar14->BuildWorkOffsetMax).x = 0.0;
      (pIVar14->BuildWorkOffsetMax).y = 0.0;
      fVar62 = (pIVar14->WorkOffsetMin).x;
      fVar65 = (pIVar14->WorkOffsetMin).y;
      IVar69.x = (pIVar14->super_ImGuiViewport).Pos.x + fVar62;
      fVar72 = ((pIVar14->super_ImGuiViewport).Size.x - fVar62) + (pIVar14->WorkOffsetMax).x;
      IVar69.y = (pIVar14->super_ImGuiViewport).Pos.y + fVar65;
      fVar62 = ((pIVar14->super_ImGuiViewport).Size.y - fVar65) + (pIVar14->WorkOffsetMax).y;
      IVar28.y = (float)(~-(uint)(fVar62 <= 0.0) & (uint)fVar62);
      IVar28.x = (float)(~-(uint)(fVar72 <= 0.0) & (uint)fVar72);
      (pIVar14->super_ImGuiViewport).WorkPos = IVar69;
      (pIVar14->super_ImGuiViewport).WorkSize = IVar28;
      lVar56 = lVar56 + 1;
    } while (lVar56 < (pIVar33->Viewports).Size);
  }
  ((pIVar31->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar12 = (GImGui->IO).Fonts;
    if ((pIVar12->Fonts).Size < 1) {
      pcVar45 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00133048:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.h"
                    ,0x703,pcVar45);
    }
    font = *(pIVar12->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar31->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x10de,"void ImGui::NewFrame()");
  }
  lVar56 = (long)(pIVar31->Viewports).Size;
  if (lVar56 < 1) {
    fVar65 = -3.4028235e+38;
    fVar62 = 3.4028235e+38;
    fVar72 = 3.4028235e+38;
    fVar64 = -3.4028235e+38;
  }
  else {
    fVar72 = 3.4028235e+38;
    lVar58 = 0;
    fVar65 = -3.4028235e+38;
    fVar66 = 3.4028235e+38;
    fVar63 = -3.4028235e+38;
    do {
      pIVar14 = (pIVar31->Viewports).Data[lVar58];
      fVar62 = (pIVar14->super_ImGuiViewport).Pos.x;
      fVar71 = (pIVar14->super_ImGuiViewport).Pos.y;
      fVar64 = (pIVar14->super_ImGuiViewport).Size.x + fVar62;
      if (fVar64 <= fVar65) {
        fVar64 = fVar65;
      }
      fVar65 = fVar64;
      fVar64 = (pIVar14->super_ImGuiViewport).Size.y + fVar71;
      if (fVar64 <= fVar63) {
        fVar64 = fVar63;
      }
      if (fVar66 <= fVar62) {
        fVar62 = fVar66;
      }
      if (fVar72 <= fVar71) {
        fVar71 = fVar72;
      }
      fVar72 = fVar71;
      lVar58 = lVar58 + 1;
      fVar66 = fVar62;
      fVar63 = fVar64;
    } while (lVar56 != lVar58);
  }
  (pIVar31->DrawListSharedData).ClipRectFullscreen.x = fVar62;
  (pIVar31->DrawListSharedData).ClipRectFullscreen.y = fVar72;
  (pIVar31->DrawListSharedData).ClipRectFullscreen.z = fVar65;
  (pIVar31->DrawListSharedData).ClipRectFullscreen.w = fVar64;
  fVar62 = (pIVar31->Style).CircleTessellationMaxError;
  (pIVar31->DrawListSharedData).CurveTessellationTol = (pIVar31->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar31->DrawListSharedData,fVar62);
  uVar43 = (uint)(pIVar31->Style).AntiAliasedLines;
  (pIVar31->DrawListSharedData).InitialFlags = uVar43;
  if (((pIVar31->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar31->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar31->DrawListSharedData).InitialFlags = uVar43 | 2;
  }
  if ((pIVar31->Style).AntiAliasedFill == true) {
    pIVar1 = &(pIVar31->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  if (((pIVar31->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar31->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  if (0 < (pIVar31->Viewports).Size) {
    lVar56 = 0;
    do {
      pIVar14 = (pIVar31->Viewports).Data[lVar56];
      (pIVar14->DrawDataP).DisplaySize.x = 0.0;
      (pIVar14->DrawDataP).DisplaySize.y = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar14->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar14->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar14->DrawDataP).DisplayPos.x = 0.0;
      (pIVar14->DrawDataP).DisplayPos.y = 0.0;
      (pIVar14->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar14->DrawDataP).field_0x1 = 0;
      (pIVar14->DrawDataP).CmdListsCount = 0;
      (pIVar14->DrawDataP).TotalIdxCount = 0;
      (pIVar14->DrawDataP).TotalVtxCount = 0;
      lVar56 = lVar56 + 1;
    } while (lVar56 < (pIVar31->Viewports).Size);
  }
  pIVar33 = GImGui;
  if ((pIVar31->DragDropActive != false) &&
     (IVar49 = (pIVar31->DragDropPayload).SourceId, IVar49 == pIVar31->ActiveId)) {
    if (GImGui->ActiveId == IVar49) {
      GImGui->ActiveIdIsAlive = IVar49;
    }
    if (pIVar33->ActiveIdPreviousFrame == IVar49) {
      pIVar33->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar31->HoveredIdPreviousFrame == 0) {
    pIVar31->HoveredIdTimer = 0.0;
LAB_0012fea6:
    pIVar31->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar31->HoveredId != 0) && (pIVar31->ActiveId == pIVar31->HoveredId))
  goto LAB_0012fea6;
  IVar49 = pIVar31->HoveredId;
  if ((IVar49 != 0) &&
     (pIVar31->HoveredIdTimer = (pIVar31->IO).DeltaTime + pIVar31->HoveredIdTimer,
     pIVar31->ActiveId != IVar49)) {
    pIVar31->HoveredIdNotActiveTimer = (pIVar31->IO).DeltaTime + pIVar31->HoveredIdNotActiveTimer;
  }
  pIVar31->HoveredIdPreviousFrame = IVar49;
  pIVar31->HoveredIdPreviousFrameUsingMouseWheel = pIVar31->HoveredIdUsingMouseWheel;
  pIVar31->HoveredId = 0;
  pIVar31->HoveredIdAllowOverlap = false;
  pIVar31->HoveredIdUsingMouseWheel = false;
  pIVar31->HoveredIdDisabled = false;
  IVar49 = pIVar31->ActiveId;
  if (((IVar49 != 0) && (pIVar31->ActiveIdIsAlive != IVar49)) &&
     (pIVar31->ActiveIdPreviousFrame == IVar49)) {
    if ((pIVar31->DebugLogFlags & 1) != 0) {
      DebugLog("NewFrame(): ClearActiveID() because it isn\'t marked alive anymore!\n");
    }
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  IVar49 = pIVar31->ActiveId;
  if (IVar49 != 0) {
    pIVar31->ActiveIdTimer = (pIVar31->IO).DeltaTime + pIVar31->ActiveIdTimer;
  }
  pIVar31->LastActiveIdTimer = (pIVar31->IO).DeltaTime + pIVar31->LastActiveIdTimer;
  pIVar31->ActiveIdPreviousFrame = IVar49;
  pIVar31->ActiveIdPreviousFrameWindow = pIVar31->ActiveIdWindow;
  pIVar31->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar31->ActiveIdHasBeenEditedBefore;
  pIVar31->ActiveIdIsAlive = 0;
  pIVar31->ActiveIdHasBeenEditedThisFrame = false;
  pIVar31->ActiveIdPreviousFrameIsAlive = false;
  pIVar31->ActiveIdIsJustActivated = false;
  if (IVar49 != pIVar31->TempInputId && pIVar31->TempInputId != 0) {
    pIVar31->TempInputId = 0;
  }
  if (IVar49 == 0) {
    (pIVar31->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    (pIVar31->ActiveIdUsingKeyInputMask).Storage[2] = 0;
    (pIVar31->ActiveIdUsingKeyInputMask).Storage[3] = 0;
    (pIVar31->ActiveIdUsingKeyInputMask).Storage[4] = 0;
    pIVar31->ActiveIdUsingNavDirMask = 0;
    pIVar31->ActiveIdUsingNavInputMask = 0;
    (pIVar31->ActiveIdUsingKeyInputMask).Storage[0] = 0;
    (pIVar31->ActiveIdUsingKeyInputMask).Storage[1] = 0;
  }
  pIVar31->DragDropAcceptIdPrev = pIVar31->DragDropAcceptIdCurr;
  pIVar31->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar31->DragDropAcceptIdCurr = 0;
  pIVar31->DragDropWithinSource = false;
  pIVar31->DragDropWithinTarget = false;
  pIVar31->DragDropHoldJustPressedId = 0;
  iVar48 = (pIVar31->InputEventsTrail).Capacity;
  if (iVar48 < 0) {
    uVar43 = iVar48 / 2 + iVar48;
    uVar44 = 0;
    if (0 < (int)uVar43) {
      uVar44 = (ulong)uVar43;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    pIVar39 = (ImGuiContext *)(*GImAllocatorAllocFunc)(uVar44 * 0x18,GImAllocatorUserData);
    pIVar15 = (pIVar31->InputEventsTrail).Data;
    if (pIVar15 != (ImGuiInputEvent *)0x0) {
      memcpy(pIVar39,pIVar15,(long)(pIVar31->InputEventsTrail).Size * 0x18);
      pIVar15 = (pIVar31->InputEventsTrail).Data;
      if ((pIVar15 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar31->InputEventsTrail).Data = (ImGuiInputEvent *)pIVar39;
    (pIVar31->InputEventsTrail).Capacity = (int)uVar44;
  }
  (pIVar31->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar31->IO).ConfigInputTrickleEventQueue);
  pIVar33 = GImGui;
  if ((GImGui->IO).BackendUsingLegacyKeyArrays == '\0') {
    pIVar39 = (ImGuiContext *)0x0;
    do {
      if (((pIVar33->IO).KeysDown[(long)pIVar39] != false) &&
         (pIVar40 = GetKeyData((ImGuiKey)pIVar39), pIVar40->Down != true)) {
        __assert_fail("(io.KeysDown[n] == false || IsKeyDown(n)) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0xf85,"void ImGui::UpdateKeyboardInputs()");
      }
      pIVar39 = (ImGuiContext *)((long)pIVar39 + 1);
    } while (pIVar39 != (ImGuiContext *)0x200);
  }
  else {
    if (GImGui->FrameCount == 0) {
      lVar56 = 0;
      do {
        if ((GImGui->IO).KeyMap[lVar56] != -1) {
          __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0xf8b,"void ImGui::UpdateKeyboardInputs()");
        }
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x200);
    }
    lVar56 = 0;
    do {
      uVar43 = (pIVar33->IO).KeyMap[lVar56 + 0x200];
      if ((ulong)uVar43 != 0xffffffff) {
        if (0x1ff < uVar43) {
          __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0xf91,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar33->IO).KeyMap[uVar43] = (int)lVar56 + 0x200;
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != 0x85);
    uVar44 = 0;
    do {
      bVar60 = (pIVar33->IO).KeysDown[uVar44];
      if ((bVar60 != false) || ((pIVar33->IO).BackendUsingLegacyKeyArrays == '\x01')) {
        uVar43 = (pIVar33->IO).KeyMap[uVar44];
        uVar50 = (uint)uVar44;
        if (uVar43 != 0xffffffff) {
          uVar50 = uVar43;
        }
        if (0x84 < uVar50 - 0x200 && uVar43 != 0xffffffff) {
          __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0xf9a,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar33->IO).KeysData[(int)uVar50].Down = bVar60;
        if (uVar44 != uVar50) {
          (pIVar33->IO).KeysDown[(int)uVar50] = (pIVar33->IO).KeysDown[uVar44];
        }
        (pIVar33->IO).BackendUsingLegacyKeyArrays = '\x01';
      }
      uVar44 = uVar44 + 1;
    } while (uVar44 != 0x200);
    if ((pIVar33->IO).BackendUsingLegacyKeyArrays == '\x01') {
      bVar60 = (pIVar33->IO).KeyShift;
      (pIVar33->IO).KeysData[0x281].Down = (pIVar33->IO).KeyCtrl;
      (pIVar33->IO).KeysData[0x282].Down = bVar60;
      (pIVar33->IO).KeysData[0x283].Down = (pIVar33->IO).KeyAlt;
      (pIVar33->IO).KeysData[0x284].Down = (pIVar33->IO).KeySuper;
    }
  }
  pIVar32 = GImGui;
  bVar60 = (GImGui->IO).KeyCtrl;
  bVar35 = (GImGui->IO).KeyShift;
  uVar43 = bVar60 + 2;
  if (bVar35 == false) {
    uVar43 = (uint)bVar60;
  }
  uVar50 = uVar43 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar50 = uVar43;
  }
  uVar43 = uVar50 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar43 = uVar50;
  }
  (pIVar33->IO).KeyMods = uVar43;
  if (((pIVar33->IO).BackendFlags & 1) == 0) {
    lVar56 = 0;
    do {
      (&(pIVar33->IO).KeysData[0x269].Down)[lVar56] = false;
      *(undefined4 *)((long)&(pIVar33->IO).KeysData[0x269].AnalogValue + lVar56) = 0;
      lVar56 = lVar56 + 0x10;
    } while (lVar56 != 0x180);
  }
  lVar56 = 0xe0c;
  do {
    fVar62 = *(float *)((long)pIVar33 + lVar56 + -4);
    *(float *)(&pIVar33->Initialized + lVar56) = fVar62;
    fVar65 = -1.0;
    if ((*(char *)((long)pIVar33 + lVar56 + -8) == '\x01') && (fVar65 = 0.0, 0.0 <= fVar62)) {
      fVar65 = fVar62 + (pIVar33->IO).DeltaTime;
    }
    *(float *)((long)pIVar33 + lVar56 + -4) = fVar65;
    lVar56 = lVar56 + 0x10;
  } while (lVar56 != 0x365c);
  (pIVar32->IO).WantSetMousePos = false;
  uVar43 = (pIVar32->IO).ConfigFlags;
  if ((uVar43 & 2) == 0) {
    bVar54 = 0;
  }
  else {
    bVar54 = (byte)(pIVar32->IO).BackendFlags & 1;
  }
  if ((bVar54 != 0) && ((pIVar32->IO).BackendUsingLegacyNavInputArray == false)) {
    lVar56 = 0;
    do {
      fVar62 = (pIVar32->IO).NavInputs[lVar56];
      if ((fVar62 != 0.0) || (NAN(fVar62))) {
        __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x27c3,"void ImGui::NavUpdate()");
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != 0x14);
    fVar62 = (pIVar32->IO).KeysData[0x26c].AnalogValue;
    (pIVar32->IO).NavInputs[0] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x26e].AnalogValue;
    (pIVar32->IO).NavInputs[1] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x26d].AnalogValue;
    (pIVar32->IO).NavInputs[3] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x26b].AnalogValue;
    (pIVar32->IO).NavInputs[2] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x271].AnalogValue;
    (pIVar32->IO).NavInputs[4] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x272].AnalogValue;
    (pIVar32->IO).NavInputs[5] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x26f].AnalogValue;
    (pIVar32->IO).NavInputs[6] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x270].AnalogValue;
    (pIVar32->IO).NavInputs[7] = fVar62;
    if (0.0 < fVar62) {
      pIVar32->NavInputSource = ImGuiInputSource_Gamepad;
    }
    fVar62 = (pIVar32->IO).KeysData[0x273].AnalogValue;
    fVar65 = (pIVar32->IO).KeysData[0x274].AnalogValue;
    (pIVar32->IO).NavInputs[0xc] = fVar62;
    (pIVar32->IO).NavInputs[0xd] = fVar65;
    (pIVar32->IO).NavInputs[0xe] = fVar62;
    (pIVar32->IO).NavInputs[0xf] = fVar65;
    (pIVar32->IO).NavInputs[8] = (pIVar32->IO).KeysData[0x27b].AnalogValue;
    (pIVar32->IO).NavInputs[9] = (pIVar32->IO).KeysData[0x27c].AnalogValue;
    (pIVar32->IO).NavInputs[10] = (pIVar32->IO).KeysData[0x279].AnalogValue;
    (pIVar32->IO).NavInputs[0xb] = (pIVar32->IO).KeysData[0x27a].AnalogValue;
  }
  if ((uVar43 & 1) != 0) {
    if ((pIVar32->IO).KeysData[0x20c].Down == true) {
      (pIVar32->IO).NavInputs[0] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar32->IO).KeysData[0x20d].Down == true) {
      (pIVar32->IO).NavInputs[2] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar32->IO).KeysData[0x20e].Down == true) {
      (pIVar32->IO).NavInputs[1] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar32->IO).KeysData[0x201].Down == true) {
      (pIVar32->IO).NavInputs[0x10] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar32->IO).KeysData[0x202].Down == true) {
      (pIVar32->IO).NavInputs[0x11] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar32->IO).KeysData[0x203].Down == true) {
      (pIVar32->IO).NavInputs[0x12] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar32->IO).KeysData[0x204].Down == true) {
      (pIVar32->IO).NavInputs[0x13] = 1.0;
      pIVar32->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (bVar60 != false) {
      (pIVar32->IO).NavInputs[0xe] = 1.0;
    }
    if (bVar35 != false) {
      (pIVar32->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar2 = (pIVar32->IO).NavInputsDownDuration;
  pfVar51 = pfVar2;
  pfVar53 = (pIVar32->IO).NavInputsDownDurationPrev;
  for (lVar56 = 0x14; lVar56 != 0; lVar56 = lVar56 + -1) {
    *pfVar53 = *pfVar51;
    pfVar51 = pfVar51 + (ulong)bVar61 * -2 + 1;
    pfVar53 = pfVar53 + (ulong)bVar61 * -2 + 1;
  }
  lVar56 = 0;
  do {
    fVar62 = -1.0;
    if (0.0 < (pIVar32->IO).NavInputs[lVar56]) {
      fVar62 = 0.0;
      if (0.0 <= pfVar2[lVar56]) {
        fVar62 = pfVar2[lVar56] + (pIVar32->IO).DeltaTime;
      }
    }
    pfVar2[lVar56] = fVar62;
    lVar56 = lVar56 + 1;
  } while (lVar56 != 0x14);
  if (pIVar32->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar32->NavInitRequest = false;
  pIVar32->NavInitRequestFromMove = false;
  pIVar32->NavInitResultId = 0;
  pIVar32->NavJustMovedToId = 0;
  if (pIVar32->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar32->NavTabbingCounter = 0;
  pIVar32->NavMoveSubmitted = false;
  pIVar32->NavMoveScoringItems = false;
  if ((((pIVar32->NavMousePosDirty == true) && (pIVar32->NavIdIsAlive == true)) &&
      (pIVar32->NavDisableHighlight == false)) && (pIVar32->NavDisableMouseHover == true)) {
    uVar55 = (undefined4)
             CONCAT71((int7)((ulong)pIVar39 >> 8),pIVar32->NavWindow != (ImGuiWindow *)0x0);
  }
  else {
    uVar55 = 0;
  }
  pIVar32->NavMousePosDirty = false;
  IVar52 = pIVar32->NavLayer;
  if (ImGuiNavLayer_Menu < IVar52) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x2802,"void ImGui::NavUpdate()");
  }
  pIVar41 = pIVar32->NavWindow;
  pIVar47 = pIVar41;
  if (pIVar41 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar47->RootWindow == pIVar47) || ((pIVar47->Flags & 0x14000000) != 0)) {
        if (pIVar47 != pIVar41) {
          pIVar47->NavLastChildNavWindow = pIVar41;
        }
        break;
      }
      ppIVar3 = &pIVar47->ParentWindow;
      pIVar47 = *ppIVar3;
    } while (*ppIVar3 != (ImGuiWindow *)0x0);
    if (((pIVar41 != (ImGuiWindow *)0x0) && (IVar52 == ImGuiNavLayer_Main)) &&
       (pIVar41->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar41->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar39 = GImGui;
  local_88 = (float)uVar43;
  pIVar41 = GetTopMostPopupModal();
  if (pIVar41 != (ImGuiWindow *)0x0) {
    pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar39->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar62 = (pIVar39->IO).DeltaTime * -10.0 + pIVar39->NavWindowingHighlightAlpha;
    fVar62 = (float)(-(uint)(0.0 <= fVar62) & (uint)fVar62);
    pIVar39->NavWindowingHighlightAlpha = fVar62;
    if ((pIVar39->DimBgRatio <= 0.0) && (fVar62 <= 0.0)) {
      pIVar39->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar41 == (ImGuiWindow *)0x0) && (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar60 = (bool)(-((pIVar39->IO).NavInputsDownDuration[3] == 0.0) & 1);
  }
  else {
    bVar60 = false;
  }
  local_6c = uVar55;
  if (((pIVar41 == (ImGuiWindow *)0x0) && (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar39->IO).KeyCtrl == true)) {
    bVar35 = IsKeyPressed(0x200,true);
  }
  else {
    bVar35 = false;
  }
  if ((bVar60 | bVar35) == 1) {
    pIVar41 = pIVar39->NavWindow;
    if (pIVar41 == (ImGuiWindow *)0x0) {
      pIVar41 = FindWindowNavFocusable((pIVar39->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar41 != (ImGuiWindow *)0x0) {
      pIVar41 = pIVar41->RootWindow;
      pIVar39->NavWindowingTargetAnim = pIVar41;
      pIVar39->NavWindowingTarget = pIVar41;
      pIVar39->NavWindowingTimer = 0.0;
      pIVar39->NavWindowingHighlightAlpha = 0.0;
      pIVar39->NavWindowingToggleLayer = bVar60;
      pIVar39->NavInputSource = bVar35 ^ ImGuiInputSource_Gamepad;
    }
  }
  fVar62 = (pIVar39->IO).DeltaTime + pIVar39->NavWindowingTimer;
  pIVar39->NavWindowingTimer = fVar62;
  if ((pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar39->NavInputSource != ImGuiInputSource_Gamepad)) {
LAB_00130988:
    bVar60 = false;
    pIVar41 = (ImGuiWindow *)0x0;
  }
  else {
    fVar65 = (fVar62 + -0.2) / 0.05;
    fVar62 = 1.0;
    if (fVar65 <= 1.0) {
      fVar62 = fVar65;
    }
    fVar62 = (float)(~-(uint)(fVar65 < 0.0) & (uint)fVar62);
    uVar43 = -(uint)(fVar62 <= pIVar39->NavWindowingHighlightAlpha);
    pIVar39->NavWindowingHighlightAlpha =
         (float)(uVar43 & (uint)pIVar39->NavWindowingHighlightAlpha | ~uVar43 & (uint)fVar62);
    fVar62 = GetNavInputAmount(0xc,ImGuiNavReadMode_RepeatSlow);
    fVar65 = GetNavInputAmount(0xd,ImGuiNavReadMode_RepeatSlow);
    iVar48 = (uint)(0.0 < fVar62) - (uint)(0.0 < fVar65);
    if (iVar48 != 0) {
      NavUpdateWindowingHighlightWindow(iVar48);
      pIVar39->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00130988;
    pbVar8 = &pIVar39->NavWindowingToggleLayer;
    *pbVar8 = (bool)(*pbVar8 &
                    (pIVar39->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar39->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar8 == false) {
      pIVar41 = pIVar39->NavWindowingTarget;
      bVar60 = false;
    }
    else {
      bVar60 = pIVar39->NavWindow != (ImGuiWindow *)0x0;
      pIVar41 = (ImGuiWindow *)0x0;
    }
    pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar39->NavInputSource == ImGuiInputSource_Keyboard)) {
    fVar65 = (pIVar39->NavWindowingTimer + -0.2) / 0.05;
    fVar62 = 1.0;
    if (fVar65 <= 1.0) {
      fVar62 = fVar65;
    }
    fVar62 = (float)(~-(uint)(fVar65 < 0.0) & (uint)fVar62);
    uVar43 = -(uint)(fVar62 <= pIVar39->NavWindowingHighlightAlpha);
    pIVar39->NavWindowingHighlightAlpha =
         (float)(uVar43 & (uint)pIVar39->NavWindowingHighlightAlpha | ~uVar43 & (uint)fVar62);
    bVar35 = IsKeyPressed(0x200,true);
    if (bVar35) {
      NavUpdateWindowingHighlightWindow((pIVar39->IO).KeyShift - 1 | 1);
    }
    if ((pIVar39->IO).KeyCtrl == false) {
      pIVar41 = pIVar39->NavWindowingTarget;
    }
  }
  if ((((pIVar39->IO).ConfigFlags & 1) != 0) && (bVar35 = IsKeyPressed(0x283,true), bVar35)) {
    pIVar39->NavWindowingToggleLayer = true;
    pIVar39->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar39->NavWindowingToggleLayer == true) &&
     (pIVar39->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (pIVar39->IO).InputQueueCharacters.Size) ||
       ((((pIVar39->IO).KeyCtrl != false || ((pIVar39->IO).KeyShift != false)) ||
        ((pIVar39->IO).KeySuper == true)))) {
      pIVar39->NavWindowingToggleLayer = false;
    }
    pfVar2 = &(GImGui->IO).KeysData[0x283].DownDurationPrev;
    bVar35 = bVar60;
    if (((0.0 < *pfVar2 || *pfVar2 == 0.0) && ((GImGui->IO).KeysData[0x283].Down == false)) &&
       ((pIVar39->NavWindowingToggleLayer == true &&
        ((pIVar39->ActiveId == 0 || (pIVar39->ActiveIdAllowOverlap == true)))))) {
      bVar36 = IsMousePosValid(&(pIVar39->IO).MousePos);
      bVar37 = IsMousePosValid(&(pIVar39->IO).MousePosPrev);
      bVar35 = true;
      if (bVar37 != bVar36) {
        bVar35 = bVar60;
      }
    }
    bVar60 = bVar35;
    if ((GImGui->IO).KeysData[0x283].Down == false) {
      pIVar39->NavWindowingToggleLayer = false;
    }
  }
  pIVar47 = pIVar39->NavWindowingTarget;
  if ((pIVar47 != (ImGuiWindow *)0x0) && ((pIVar47->Flags & 4) == 0)) {
    fVar62 = 0.0;
    fVar65 = 0.0;
    if ((pIVar39->NavInputSource == ImGuiInputSource_Keyboard) && ((pIVar39->IO).KeyShift == false))
    {
      fVar62 = (float)(int)(GImGui->IO).KeysData[0x202].Down -
               (float)(int)(GImGui->IO).KeysData[0x201].Down;
      fVar65 = (float)(int)(GImGui->IO).KeysData[0x204].Down -
               (float)(int)(GImGui->IO).KeysData[0x203].Down;
    }
    if (pIVar39->NavInputSource == ImGuiInputSource_Gamepad) {
      IVar28 = GetNavInputAmount2d(8,ImGuiNavReadMode_Down,0.0,0.0);
      fVar62 = IVar28.x;
      fVar65 = IVar28.y;
    }
    if (((fVar62 != 0.0) || (fVar65 != 0.0)) || (NAN(fVar65))) {
      fVar72 = (pIVar39->IO).DisplayFramebufferScale.x;
      fVar64 = (pIVar39->IO).DisplayFramebufferScale.y;
      if (fVar64 <= fVar72) {
        fVar72 = fVar64;
      }
      fVar72 = (float)(int)(fVar72 * (pIVar39->IO).DeltaTime * 800.0);
      pIVar47 = pIVar47->RootWindow;
      local_98.Min.y = fVar65 * fVar72 + (pIVar47->Pos).y;
      local_98.Min.x = fVar62 * fVar72 + (pIVar47->Pos).x;
      SetWindowPos(pIVar47,&local_98.Min,1);
      pIVar39->NavDisableMouseHover = true;
    }
  }
  if (pIVar41 != (ImGuiWindow *)0x0) {
    if ((pIVar39->NavWindow == (ImGuiWindow *)0x0) || (pIVar41 != pIVar39->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar33 = GImGui;
      pIVar33->NavMousePosDirty = true;
      pIVar33->NavDisableHighlight = false;
      pIVar33->NavDisableMouseHover = true;
      pIVar47 = pIVar41->NavLastChildNavWindow;
      if ((pIVar47 == (ImGuiWindow *)0x0) || (pIVar47->WasActive == false)) {
        pIVar47 = pIVar41;
      }
      ClosePopupsOverWindow(pIVar47,false);
      FocusWindow(pIVar47);
      if (pIVar47->NavLastIds[0] == 0) {
        NavInitWindow(pIVar47,false);
      }
      if ((pIVar47->DC).NavLayersActiveMaskNext == 2) {
        pIVar39->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar60) && (pIVar39->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar41 = pIVar39->NavWindow;
    pIVar47 = pIVar41;
    do {
      window = pIVar47;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar47 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar41) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar41;
    }
    IVar52 = ImGuiNavLayer_Main;
    if (((pIVar39->NavWindow->DC).NavLayersActiveMask & 2) != 0) {
      IVar52 = pIVar39->NavLayer ^ ImGuiNavLayer_Menu;
    }
    if (IVar52 != pIVar39->NavLayer) {
      if (IVar52 == ImGuiNavLayer_Menu) {
        pIVar39->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer(IVar52);
      pIVar39 = GImGui;
      pIVar39->NavMousePosDirty = true;
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
    }
  }
  fVar62 = (float)CONCAT31((int3)((uint)local_88 >> 8),SUB41(local_88,0) | bVar54);
  if ((((uint)local_88 & 1) == 0 && bVar54 == 0) || (pIVar32->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar32->IO).NavActive = false;
LAB_00130dfe:
    bVar60 = pIVar32->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar60 = (pIVar32->NavWindow->Flags & 0x40000U) == 0;
    (pIVar32->IO).NavActive = bVar60;
    if (((!bVar60) || (pIVar32->NavId == 0)) ||
       (bVar60 = true, pIVar32->NavDisableHighlight != false)) goto LAB_00130dfe;
  }
  (pIVar32->IO).NavVisible = bVar60;
  pIVar39 = GImGui;
  fVar65 = (GImGui->IO).NavInputsDownDuration[1];
  local_88 = fVar62;
  if ((fVar65 == 0.0) && (!NAN(fVar65))) {
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] ImGuiNavInput_Cancel\n");
    }
    if (pIVar39->ActiveId == 0) {
      if (pIVar39->NavLayer == ImGuiNavLayer_Main) {
        pIVar41 = pIVar39->NavWindow;
        if (((pIVar41 == (ImGuiWindow *)0x0) || (pIVar41 == pIVar41->RootWindow)) ||
           (((pIVar41->Flags & 0x4000000) != 0 ||
            (pIVar47 = pIVar41->ParentWindow, pIVar47 == (ImGuiWindow *)0x0)))) {
          iVar48 = (pIVar39->OpenPopupStack).Size;
          if (((long)iVar48 < 1) ||
             ((((pIVar39->OpenPopupStack).Data[(long)iVar48 + -1].Window)->Flags & 0x8000000) != 0))
          {
            if ((pIVar41 != (ImGuiWindow *)0x0) && ((pIVar41->Flags & 0x5000000U) != 0x1000000)) {
              pIVar41->NavLastIds[0] = 0;
            }
            pIVar39->NavId = 0;
            pIVar39->NavFocusScopeId = 0;
          }
          else {
            ClosePopupToLevel(iVar48 + -1,true);
          }
          goto LAB_0013104a;
        }
        if (pIVar41->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2984,"void ImGui::NavUpdateCancelRequest()");
        }
        fVar62 = (pIVar41->Pos).x;
        local_68 = ZEXT416((uint)fVar62);
        fVar65 = (pIVar41->Pos).y;
        local_48 = ZEXT416((uint)fVar65);
        fVar72 = (pIVar41->Size).x;
        local_58 = ZEXT416((uint)((pIVar41->Size).y + fVar65));
        FocusWindow(pIVar47);
        fVar65 = (pIVar47->DC).CursorStartPos.x;
        fVar64 = (pIVar47->DC).CursorStartPos.y;
        local_98.Min.x = (float)local_68._0_4_ - fVar65;
        local_98.Min.y = (float)local_48._0_4_ - fVar64;
        local_98.Max.y = (float)local_58._0_4_ - fVar64;
        local_98.Max.x = (fVar72 + fVar62) - fVar65;
        SetNavID(pIVar41->ChildId,ImGuiNavLayer_Main,0,&local_98);
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      pIVar39 = GImGui;
      pIVar39->NavMousePosDirty = true;
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
LAB_0013104a:
  pIVar32->NavActivateId = 0;
  pIVar32->NavActivateDownId = 0;
  pIVar32->NavActivatePressedId = 0;
  pIVar32->NavActivateInputId = 0;
  pIVar32->NavActivateFlags = 0;
  IVar49 = pIVar32->NavId;
  if ((((IVar49 != 0) && (pIVar32->NavDisableHighlight == false)) &&
      (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar32->NavWindow != (ImGuiWindow *)0x0 && ((pIVar32->NavWindow->Flags & 0x40000) == 0)))) {
    fVar62 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar62) {
      bVar60 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar60 = false;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar35 = false;
    }
    else {
      bVar35 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
    }
    IVar10 = pIVar32->ActiveId;
    if (bVar60 && IVar10 == 0) {
      pIVar32->NavActivateId = IVar49;
      pIVar32->NavActivateFlags = 2;
    }
    if (IVar10 == 0) {
      if (bVar35) goto LAB_001315a8;
    }
    else if ((bool)(bVar35 & IVar10 == IVar49)) {
LAB_001315a8:
      pIVar32->NavActivateInputId = IVar49;
      pIVar32->NavActivateFlags = 1;
    }
    if (IVar10 == 0) {
      if (0.0 < fVar62) goto LAB_001315d3;
    }
    else if (IVar10 == IVar49 && 0.0 < fVar62) {
LAB_001315d3:
      pIVar32->NavActivateDownId = IVar49;
    }
    if (IVar10 == 0) {
      if (bVar60) goto LAB_00131603;
    }
    else if ((bool)(bVar60 & IVar10 == IVar49)) {
LAB_00131603:
      pIVar32->NavActivatePressedId = IVar49;
    }
  }
  if ((pIVar32->NavWindow != (ImGuiWindow *)0x0) && ((pIVar32->NavWindow->Flags & 0x40000) != 0)) {
    pIVar32->NavDisableHighlight = true;
  }
  if ((pIVar32->NavActivateId != 0) && (pIVar32->NavActivateDownId != pIVar32->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x282f,"void ImGui::NavUpdate()");
  }
  IVar49 = pIVar32->NavNextActivateId;
  if (IVar49 != 0) {
    if ((pIVar32->NavNextActivateFlags & 1U) == 0) {
      pIVar32->NavActivatePressedId = IVar49;
      pIVar32->NavActivateDownId = IVar49;
      pIVar32->NavActivateId = IVar49;
    }
    else {
      pIVar32->NavActivateInputId = IVar49;
    }
    pIVar32->NavActivateFlags = pIVar32->NavNextActivateFlags;
  }
  pIVar32->NavNextActivateId = 0;
  pIVar39 = GImGui;
  pIVar41 = GImGui->NavWindow;
  if ((pIVar41 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x2892,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->NavMoveFlags & 0x80) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x2893,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavMoveRequestForward %d\n");
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar39->NavMoveFlags = 0;
    pIVar39->NavMoveScrollFlags = 0;
    if (((pIVar41 != (ImGuiWindow *)0x0) && (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar41->Flags & 0x40000) == 0)) {
      uVar43 = pIVar39->ActiveIdUsingNavDirMask;
      if (((uVar43 & 1) == 0) &&
         ((fVar62 = GetNavInputAmount(4,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
          (fVar62 = GetNavInputAmount(0x10,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
        pIVar39->NavMoveDir = 0;
      }
      if (((uVar43 & 2) == 0) &&
         ((fVar62 = GetNavInputAmount(5,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
          (fVar62 = GetNavInputAmount(0x11,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
        pIVar39->NavMoveDir = 1;
      }
      if (((uVar43 & 4) == 0) &&
         ((fVar62 = GetNavInputAmount(6,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
          (fVar62 = GetNavInputAmount(0x12,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
        pIVar39->NavMoveDir = 2;
      }
      if (((uVar43 & 8) == 0) &&
         ((fVar62 = GetNavInputAmount(7,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
          (fVar62 = GetNavInputAmount(0x13,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
        pIVar39->NavMoveDir = 3;
      }
    }
    pIVar39->NavMoveClipDir = pIVar39->NavMoveDir;
    (pIVar39->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar39->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar39->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar39->NavScoringNoClipRect).Max.y = -3.4028235e+38;
  }
  pIVar33 = GImGui;
  fVar62 = 0.0;
  if ((((pIVar41 != (ImGuiWindow *)0x0) && (pIVar39->NavMoveDir == -1)) &&
      (((pIVar39->IO).ConfigFlags & 1U) != 0)) &&
     ((pIVar47 = GImGui->NavWindow, (pIVar47->Flags & 0x40000) == 0 &&
      (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) {
    uVar43 = 0;
    uVar44 = 0;
    if ((GImGui->IO).KeysData[0x205].Down == true) {
      uVar44 = (ulong)(((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0);
    }
    local_58._0_4_ = (int)uVar44;
    if ((GImGui->IO).KeysData[0x206].Down == true) {
      uVar43 = (uint)(((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0);
    }
    bVar60 = IsKeyPressed(0x207,true);
    if (bVar60) {
      local_68._0_4_ =
           (int)CONCAT71((int7)((ulong)GImGui >> 8),
                         ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0);
    }
    else {
      auVar30._12_4_ = 0;
      auVar30._0_12_ = local_68._4_12_;
      local_68 = auVar30 << 0x20;
    }
    bVar60 = IsKeyPressed(0x208,true);
    if (bVar60) {
      uVar44 = CONCAT71((int7)(uVar44 >> 8),
                        ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0);
    }
    else {
      uVar44 = 0;
    }
    if ((local_58._0_4_ != uVar43) || (fVar62 = 0.0, local_68[0] != (char)uVar44)) {
      local_48._0_4_ = (int)uVar44;
      if (pIVar33->NavLayer != ImGuiNavLayer_Main) {
        NavRestoreLayer(ImGuiNavLayer_Main);
        uVar44 = (ulong)(uint)local_48._0_4_;
      }
      if (((pIVar47->DC).NavLayersActiveMask == 0) && ((pIVar47->DC).NavHasScroll == true)) {
        bVar60 = IsKeyPressed(0x205,true);
        if (bVar60) {
          fVar62 = (pIVar47->Scroll).y - ((pIVar47->InnerRect).Max.y - (pIVar47->InnerRect).Min.y);
        }
        else {
          bVar60 = IsKeyPressed(0x206,true);
          if (!bVar60) {
            if (local_68[0] == '\0') {
              fVar62 = 0.0;
              if ((char)uVar44 != '\0') {
                (pIVar47->ScrollTarget).y = (pIVar47->ScrollMax).y;
                (pIVar47->ScrollTargetCenterRatio).y = 0.0;
                (pIVar47->ScrollTargetEdgeSnapDist).y = 0.0;
              }
            }
            else {
              (pIVar47->ScrollTarget).y = 0.0;
              (pIVar47->ScrollTargetCenterRatio).y = 0.0;
              (pIVar47->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00131684:
              fVar62 = 0.0;
            }
            goto LAB_0013172e;
          }
          fVar62 = ((pIVar47->InnerRect).Max.y - (pIVar47->InnerRect).Min.y) + (pIVar47->Scroll).y;
        }
        (pIVar47->ScrollTarget).y = fVar62;
        (pIVar47->ScrollTargetCenterRatio).y = 0.0;
        (pIVar47->ScrollTargetEdgeSnapDist).y = 0.0;
        fVar62 = 0.0;
      }
      else {
        IVar52 = pIVar33->NavLayer;
        fVar62 = GImGui->FontBaseSize * pIVar47->FontWindowScale;
        if (pIVar47->ParentWindow != (ImGuiWindow *)0x0) {
          fVar62 = fVar62 * pIVar47->ParentWindow->FontWindowScale;
        }
        local_58._0_8_ = pIVar47->NavRectRel + IVar52;
        fVar62 = (pIVar47->NavRectRel[IVar52].Max.y - pIVar47->NavRectRel[IVar52].Min.y) +
                 (((pIVar47->InnerRect).Max.y - (pIVar47->InnerRect).Min.y) - fVar62);
        fVar62 = (float)(~-(uint)(fVar62 <= 0.0) & (uint)fVar62);
        bVar60 = IsKeyPressed(0x205,true);
        if (bVar60) {
          fVar62 = -fVar62;
          pIVar33->NavMoveDir = 3;
          pIVar33->NavMoveClipDir = 2;
          pIVar33->NavMoveFlags = 0x30;
        }
        else {
          bVar60 = IsKeyPressed(0x206,true);
          if (bVar60) {
            pIVar33->NavMoveDir = 2;
            pIVar33->NavMoveClipDir = 3;
            pIVar33->NavMoveFlags = 0x30;
          }
          else {
            if (local_68[0] != '\0') {
              *(float *)(local_58._0_8_ + 0xc) = 0.0;
              *(float *)(local_58._0_8_ + 4) = 0.0;
              if (*(float *)(local_58._0_8_ + 8) <= *(float *)local_58._0_8_ &&
                  *(float *)local_58._0_8_ != *(float *)(local_58._0_8_ + 8)) {
                *(float *)(local_58._0_8_ + 8) = 0.0;
                *(float *)local_58._0_8_ = 0.0;
              }
              pIVar33->NavMoveDir = 3;
              pIVar33->NavMoveFlags = 0x50;
              goto LAB_00131684;
            }
            fVar62 = 0.0;
            if (local_48[0] != '\0') {
              fVar65 = (pIVar47->ContentSize).y;
              *(float *)(local_58._0_8_ + 0xc) = fVar65;
              *(float *)(local_58._0_8_ + 4) = fVar65;
              if (*(float *)(local_58._0_8_ + 8) <= *(float *)local_58._0_8_ &&
                  *(float *)local_58._0_8_ != *(float *)(local_58._0_8_ + 8)) {
                *(float *)(local_58._0_8_ + 8) = 0.0;
                *(float *)local_58._0_8_ = 0.0;
              }
              pIVar33->NavMoveDir = 2;
              pIVar33->NavMoveFlags = 0x50;
            }
          }
        }
      }
    }
  }
LAB_0013172e:
  if ((fVar62 != 0.0) || (NAN(fVar62))) {
    IVar28 = (pIVar41->InnerRect).Max;
    (pIVar39->NavScoringNoClipRect).Min = (pIVar41->InnerRect).Min;
    (pIVar39->NavScoringNoClipRect).Max = IVar28;
    (pIVar39->NavScoringNoClipRect).Min.y = (pIVar39->NavScoringNoClipRect).Min.y + fVar62;
    (pIVar39->NavScoringNoClipRect).Max.y = (pIVar39->NavScoringNoClipRect).Max.y + fVar62;
  }
  pIVar39->NavMoveForwardToNextFrame = false;
  if (pIVar39->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar39->NavMoveDir,pIVar39->NavMoveClipDir,pIVar39->NavMoveFlags,
               pIVar39->NavMoveScrollFlags);
  }
  if ((pIVar39->NavMoveSubmitted == true) && (pIVar39->NavId == 0)) {
    if ((pIVar39->DebugLogFlags & 8) != 0) {
      if (pIVar41 == (ImGuiWindow *)0x0) {
        pcVar45 = "<NULL>";
      }
      else {
        pcVar45 = pIVar41->Name;
      }
      DebugLog("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n",pcVar45,
               (ulong)pIVar39->NavLayer);
    }
    pIVar39->NavInitRequest = true;
    pIVar39->NavInitRequestFromMove = true;
    pIVar39->NavInitResultId = 0;
    pIVar39->NavDisableHighlight = false;
  }
  if (((pIVar39->NavMoveSubmitted == true) && (pIVar39->NavInputSource == ImGuiInputSource_Gamepad))
     && (uVar44 = (ulong)pIVar39->NavLayer, uVar44 == 0 && pIVar41 != (ImGuiWindow *)0x0)) {
    uVar43 = pIVar39->NavMoveFlags;
    fVar65 = (pIVar41->DC).CursorStartPos.x;
    fVar72 = (pIVar41->DC).CursorStartPos.y;
    local_98.Min.x = ((pIVar41->InnerRect).Min.x + -1.0) - fVar65;
    fVar64 = ((pIVar41->InnerRect).Min.y + -1.0) - fVar72;
    local_98.Min.y = fVar64;
    local_98.Max.x = ((pIVar41->InnerRect).Max.x + 1.0) - fVar65;
    fVar72 = ((pIVar41->InnerRect).Max.y + 1.0) - fVar72;
    local_98.Max.y = fVar72;
    if ((uVar43 & 5) == 0 || (uVar43 & 10) == 0) {
      if (((pIVar41->NavRectRel[uVar44].Min.x < local_98.Min.x) ||
          (pIVar41->NavRectRel[uVar44].Min.y < fVar64)) ||
         ((local_98.Max.x < pIVar41->NavRectRel[uVar44].Max.x ||
          (fVar72 < pIVar41->NavRectRel[uVar44].Max.y)))) {
        fVar66 = GImGui->FontBaseSize * pIVar41->FontWindowScale;
        pIVar47 = pIVar41->ParentWindow;
        fVar65 = fVar66;
        if (pIVar47 != (ImGuiWindow *)0x0) {
          fVar65 = pIVar47->FontWindowScale * fVar66;
        }
        if (pIVar47 != (ImGuiWindow *)0x0) {
          fVar66 = fVar66 * pIVar47->FontWindowScale;
        }
        fVar63 = local_98.Max.x - local_98.Min.x;
        if (fVar65 * 0.5 <= local_98.Max.x - local_98.Min.x) {
          fVar63 = fVar65 * 0.5;
        }
        local_98.Min.y = -3.4028235e+38;
        bVar60 = (uVar43 & 5) == 0;
        if (bVar60) {
          local_98.Min.x = local_98.Min.x + fVar63;
        }
        else {
          local_98.Min.x = -3.4028235e+38;
        }
        local_98.Max.y = 3.4028235e+38;
        if (bVar60) {
          local_98.Max.x = local_98.Max.x - fVar63;
        }
        else {
          local_98.Max.x = 3.4028235e+38;
        }
        fVar65 = fVar72 - fVar64;
        if (fVar66 * 0.5 <= fVar72 - fVar64) {
          fVar65 = fVar66 * 0.5;
        }
        bVar60 = (uVar43 & 10) == 0;
        if (bVar60) {
          local_98.Min.y = fVar64 + fVar65;
        }
        if (bVar60) {
          local_98.Max.y = fVar72 - fVar65;
        }
        ImRect::ClipWithFull(pIVar41->NavRectRel + uVar44,&local_98);
        pIVar39->NavId = 0;
        pIVar39->NavFocusScopeId = 0;
      }
    }
  }
  if (pIVar41 == (ImGuiWindow *)0x0) {
    fVar65 = 0.0;
    fVar62 = 0.0;
    IVar70.x = 0.0;
    IVar70.y = 0.0;
  }
  else {
    IVar52 = pIVar39->NavLayer;
    fVar65 = pIVar41->NavRectRel[IVar52].Max.x;
    fVar72 = pIVar41->NavRectRel[IVar52].Min.x;
    fVar64 = pIVar41->NavRectRel[IVar52].Min.y;
    fVar66 = pIVar41->NavRectRel[IVar52].Max.y;
    fVar63 = 0.0;
    fVar71 = 0.0;
    fVar67 = 0.0;
    fVar68 = 0.0;
    if (fVar72 <= fVar65 && fVar64 <= fVar66) {
      fVar63 = fVar72;
      fVar71 = fVar64;
      fVar67 = fVar66;
      fVar68 = fVar65;
    }
    fVar65 = (pIVar41->DC).CursorStartPos.y;
    fVar72 = fVar71 + fVar65 + fVar62;
    fVar62 = fVar67 + fVar65 + fVar62;
    if (fVar62 < fVar72) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x28ec,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    fVar65 = (pIVar41->DC).CursorStartPos.x;
    fVar68 = fVar68 + fVar65;
    fVar65 = fVar63 + fVar65 + 1.0;
    if (fVar68 <= fVar65) {
      fVar65 = fVar68;
    }
    IVar70.y = fVar72;
    IVar70.x = fVar65;
  }
  IVar22.y = fVar62;
  IVar22.x = fVar65;
  (pIVar39->NavScoringRect).Min = IVar70;
  (pIVar39->NavScoringRect).Max = IVar22;
  if (IVar70.x < (pIVar39->NavScoringNoClipRect).Min.x) {
    (pIVar39->NavScoringNoClipRect).Min.x = IVar70.x;
  }
  if (IVar70.y < (pIVar39->NavScoringNoClipRect).Min.y) {
    (pIVar39->NavScoringNoClipRect).Min.y = IVar70.y;
  }
  pIVar4 = &(pIVar39->NavScoringNoClipRect).Max;
  if (pIVar4->x <= fVar65 && fVar65 != pIVar4->x) {
    (pIVar39->NavScoringNoClipRect).Max.x = fVar65;
  }
  pfVar2 = &(pIVar39->NavScoringNoClipRect).Max.y;
  if (*pfVar2 <= fVar62 && fVar62 != *pfVar2) {
    (pIVar39->NavScoringNoClipRect).Max.y = fVar62;
  }
  pIVar39 = GImGui;
  if (pIVar32->NavMoveDir == -1) {
    if (GImGui->NavMoveDir != -1) {
      __assert_fail("g.NavMoveDir == ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x28f8,"void ImGui::NavUpdateCreateTabbingRequest()");
    }
    pIVar41 = GImGui->NavWindow;
    if (((pIVar41 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       (((pIVar41->Flags & 0x40000) == 0 &&
        ((((bVar60 = IsKeyPressed(0x200,true), bVar60 &&
           (((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)) &&
          ((pIVar39->IO).KeyCtrl == false)) && ((pIVar39->IO).KeyAlt == false)))))) {
      uVar43 = 0xffffffff;
      if ((pIVar39->IO).KeyShift == false) {
        uVar43 = (uint)(pIVar39->ActiveId != 0);
      }
      pIVar39->NavTabbingDir = uVar43;
      scroll_flags = 3;
      if (pIVar41->Appearing != false) {
        scroll_flags = 0x21;
      }
      NavMoveRequestSubmit(-1,uVar43 >> 0x1f ^ 3,0x400,scroll_flags);
      pIVar39->NavTabbingCounter = -1;
    }
  }
  fVar62 = local_88;
  pIVar39 = GImGui;
  if (GImGui->NavMoveScoringItems == false) {
    pbVar8 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar8;
    if (*pbVar8 != false) goto LAB_00131b80;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00131b80:
    if (pIVar39->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x2742,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar32->NavIdIsAlive = false;
  pIVar41 = pIVar32->NavWindow;
  if (((pIVar41 != (ImGuiWindow *)0x0) && ((pIVar41->Flags & 0x40000) == 0)) &&
     (pIVar32->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar65 = pIVar39->FontBaseSize * pIVar41->FontWindowScale;
    if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
      fVar65 = fVar65 * pIVar41->ParentWindow->FontWindowScale;
    }
    fVar65 = (float)(int)(fVar65 * 100.0 * (pIVar32->IO).DeltaTime + 0.5);
    if (((pIVar41->DC).NavLayersActiveMask == 0) &&
       (uVar43 = pIVar32->NavMoveDir, (uVar43 != 0xffffffff & (pIVar41->DC).NavHasScroll) == 1)) {
      if (uVar43 < 2) {
        (pIVar41->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_001ac190 + (ulong)(uVar43 == 0) * 4) * fVar65 +
                         (pIVar41->Scroll).x);
        (pIVar41->ScrollTargetCenterRatio).x = 0.0;
        (pIVar41->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar43 & 0xfffffffe) == 2) {
        (pIVar41->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_001ac190 + (ulong)(uVar43 == 2) * 4) * fVar65 +
                         (pIVar41->Scroll).y);
        (pIVar41->ScrollTargetCenterRatio).y = 0.0;
        (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar28 = GetNavInputAmount2d(8,ImGuiNavReadMode_Down,0.1,10.0);
    fVar72 = IVar28.x;
    fVar64 = IVar28.y;
    if (((fVar72 != 0.0) || (NAN(fVar72))) && (pIVar41->ScrollbarX == true)) {
      (pIVar41->ScrollTarget).x = (float)(int)(fVar72 * fVar65 + (pIVar41->Scroll).x);
      (pIVar41->ScrollTargetCenterRatio).x = 0.0;
      (pIVar41->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar64 != 0.0) || (NAN(fVar64))) {
      (pIVar41->ScrollTarget).y = (float)(int)(fVar64 * fVar65 + (pIVar41->Scroll).y);
      (pIVar41->ScrollTargetCenterRatio).y = 0.0;
      (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if (((uint)fVar62 & 1) == 0) {
    pIVar32->NavDisableHighlight = true;
    pIVar32->NavDisableMouseHover = false;
  }
  else if ((((char)local_6c != '\0') && (((pIVar32->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar32->IO).BackendFlags & 4) != 0)) {
    IVar28 = NavCalcPreferredRefPos();
    (pIVar32->IO).MousePosPrev = IVar28;
    (pIVar32->IO).MousePos = IVar28;
    (pIVar32->IO).WantSetMousePos = true;
  }
  pIVar32->NavScoringDebugCount = 0;
  pIVar39 = GImGui;
  pIVar4 = &(GImGui->IO).MousePos;
  bVar60 = IsMousePosValid(pIVar4);
  if (!bVar60) goto LAB_00131e1b;
  fVar62 = pIVar4->x;
  if (0.0 <= fVar62) {
LAB_00131dcb:
    iVar48 = (int)fVar62;
  }
  else {
    if ((fVar62 == (float)(int)fVar62) && (!NAN(fVar62) && !NAN((float)(int)fVar62)))
    goto LAB_00131dcb;
    iVar48 = (int)fVar62 + -1;
  }
  fVar62 = (pIVar39->IO).MousePos.y;
  if (0.0 <= fVar62) {
LAB_00131df6:
    iVar38 = (int)fVar62;
  }
  else {
    if ((fVar62 == (float)(int)fVar62) && (!NAN(fVar62) && !NAN((float)(int)fVar62)))
    goto LAB_00131df6;
    iVar38 = (int)fVar62 + -1;
  }
  IVar23.y = (float)iVar38;
  IVar23.x = (float)iVar48;
  pIVar39->MouseLastValidPos = IVar23;
  IVar24.y = (float)iVar38;
  IVar24.x = (float)iVar48;
  (pIVar39->IO).MousePos = IVar24;
LAB_00131e1b:
  bVar60 = IsMousePosValid(pIVar4);
  if ((bVar60) && (bVar60 = IsMousePosValid(&(pIVar39->IO).MousePosPrev), bVar60)) {
    IVar25.y = (pIVar39->IO).MousePos.y - (pIVar39->IO).MousePosPrev.y;
    IVar25.x = (pIVar39->IO).MousePos.x - (pIVar39->IO).MousePosPrev.x;
    (pIVar39->IO).MouseDelta = IVar25;
  }
  else {
    (pIVar39->IO).MouseDelta.x = 0.0;
    (pIVar39->IO).MouseDelta.y = 0.0;
  }
  fVar62 = (pIVar39->IO).MouseDelta.x;
  if ((((fVar62 != 0.0) || (NAN(fVar62))) || (fVar62 = (pIVar39->IO).MouseDelta.y, fVar62 != 0.0))
     || (NAN(fVar62))) {
    pIVar39->NavDisableMouseHover = false;
  }
  (pIVar39->IO).MousePosPrev = (pIVar39->IO).MousePos;
  lVar56 = 0;
  do {
    bVar60 = (pIVar39->IO).MouseDown[lVar56];
    if (bVar60 == true) {
      pfVar2 = (pIVar39->IO).MouseDownDuration + lVar56;
      bVar35 = *pfVar2 <= 0.0 && *pfVar2 != 0.0;
    }
    else {
      bVar35 = false;
    }
    (pIVar39->IO).MouseClicked[lVar56] = bVar35;
    (pIVar39->IO).MouseClickedCount[lVar56] = 0;
    if (bVar60 == false) {
      bVar36 = 0.0 <= (pIVar39->IO).MouseDownDuration[lVar56];
    }
    else {
      bVar36 = false;
    }
    (pIVar39->IO).MouseReleased[lVar56] = bVar36;
    fVar62 = (pIVar39->IO).MouseDownDuration[lVar56];
    (pIVar39->IO).MouseDownDurationPrev[lVar56] = fVar62;
    fVar65 = -1.0;
    if ((bVar60 != false) && (fVar65 = 0.0, 0.0 <= fVar62)) {
      fVar65 = fVar62 + (pIVar39->IO).DeltaTime;
    }
    (pIVar39->IO).MouseDownDuration[lVar56] = fVar65;
    if (bVar35 == false) {
      if (bVar60 != false) {
        bVar60 = IsMousePosValid(pIVar4);
        fVar62 = 0.0;
        if (bVar60) {
          fVar62 = (pIVar39->IO).MousePos.x - (pIVar39->IO).MouseClickedPos[lVar56].x;
          fVar65 = (pIVar39->IO).MousePos.y - (pIVar39->IO).MouseClickedPos[lVar56].y;
          fVar62 = fVar62 * fVar62 + fVar65 * fVar65;
        }
        fVar65 = (pIVar39->IO).MouseDragMaxDistanceSqr[lVar56];
        uVar43 = -(uint)(fVar62 <= fVar65);
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar56] =
             (float)(~uVar43 & (uint)fVar62 | (uint)fVar65 & uVar43);
      }
    }
    else {
      if ((pIVar39->IO).MouseDoubleClickTime <=
          (float)(pIVar39->Time - (pIVar39->IO).MouseClickedTime[lVar56])) {
LAB_0013205e:
        (pIVar39->IO).MouseClickedLastCount[lVar56] = 1;
      }
      else {
        bVar60 = IsMousePosValid(pIVar4);
        fVar62 = 0.0;
        fVar65 = 0.0;
        if (bVar60) {
          fVar62 = (pIVar39->IO).MousePos.x - (pIVar39->IO).MouseClickedPos[lVar56].x;
          fVar65 = (pIVar39->IO).MousePos.y - (pIVar39->IO).MouseClickedPos[lVar56].y;
        }
        fVar72 = (pIVar39->IO).MouseDoubleClickMaxDist;
        if (fVar72 * fVar72 <= fVar62 * fVar62 + fVar65 * fVar65) goto LAB_0013205e;
        pIVar9 = (pIVar39->IO).MouseClickedLastCount + lVar56;
        *pIVar9 = *pIVar9 + 1;
      }
      (pIVar39->IO).MouseClickedTime[lVar56] = pIVar39->Time;
      (pIVar39->IO).MouseClickedPos[lVar56] = (pIVar39->IO).MousePos;
      (pIVar39->IO).MouseClickedCount[lVar56] = (pIVar39->IO).MouseClickedLastCount[lVar56];
      (pIVar39->IO).MouseDragMaxDistanceSqr[lVar56] = 0.0;
    }
    (pIVar39->IO).MouseDoubleClicked[lVar56] = (pIVar39->IO).MouseClickedCount[lVar56] == 2;
    if ((pIVar39->IO).MouseClicked[lVar56] == true) {
      pIVar39->NavDisableMouseHover = false;
    }
    lVar56 = lVar56 + 1;
  } while (lVar56 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar41 = GetTopMostPopupModal();
  if ((pIVar41 != (ImGuiWindow *)0x0) ||
     ((pIVar31->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar31->NavWindowingHighlightAlpha)))) {
    fVar62 = (pIVar31->IO).DeltaTime * 6.0 + pIVar31->DimBgRatio;
    if (1.0 <= fVar62) {
      fVar62 = 1.0;
    }
    pIVar31->DimBgRatio = fVar62;
  }
  else {
    fVar62 = (pIVar31->IO).DeltaTime * -10.0 + pIVar31->DimBgRatio;
    pIVar31->DimBgRatio = (float)(-(uint)(0.0 <= fVar62) & (uint)fVar62);
  }
  pIVar31->MouseCursor = 0;
  pIVar31->WantTextInputNextFrame = -1;
  pIVar31->WantCaptureMouseNextFrame = -1;
  pIVar31->WantCaptureKeyboardNextFrame = -1;
  uVar34 = *(undefined3 *)&(pIVar31->PlatformImeData).field_0x1;
  fVar62 = (pIVar31->PlatformImeData).InputPos.x;
  uVar29 = *(undefined8 *)&(pIVar31->PlatformImeData).InputPos.y;
  (pIVar31->PlatformImeDataPrev).WantVisible = (pIVar31->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar31->PlatformImeDataPrev).field_0x1 = uVar34;
  (pIVar31->PlatformImeDataPrev).InputPos.x = fVar62;
  *(undefined8 *)&(pIVar31->PlatformImeDataPrev).InputPos.y = uVar29;
  (pIVar31->PlatformImeData).WantVisible = false;
  pIVar39 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar60 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar60) &&
       (fVar65 = (pIVar39->IO).MousePos.x - (pIVar39->WheelingWindowRefMousePos).x,
       fVar72 = (pIVar39->IO).MousePos.y - (pIVar39->WheelingWindowRefMousePos).y,
       fVar62 = (pIVar39->IO).MouseDragThreshold,
       fVar62 * fVar62 < fVar65 * fVar65 + fVar72 * fVar72)) {
      pIVar39->WheelingWindowTimer = 0.0;
    }
    if (pIVar39->WheelingWindowTimer <= 0.0) {
      pIVar39->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar39->WheelingWindowTimer = 0.0;
    }
  }
  pIVar33 = GImGui;
  fVar62 = (pIVar39->IO).MouseWheel;
  fVar65 = (pIVar39->IO).MouseWheelH;
  if (((((fVar65 != 0.0) || (fVar62 != 0.0)) || (NAN(fVar62))) &&
      ((pIVar39->ActiveId == 0 || (pIVar39->ActiveIdUsingMouseWheel == false)))) &&
     ((pIVar39->HoveredIdPreviousFrame == 0 ||
      (pIVar39->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
    pIVar41 = pIVar39->WheelingWindow;
    if (pIVar41 == (ImGuiWindow *)0x0) {
      pIVar41 = pIVar39->HoveredWindow;
    }
    if ((pIVar41 != (ImGuiWindow *)0x0) && (pIVar41->Collapsed == false)) {
      if (((fVar62 == 0.0) && (!NAN(fVar62))) ||
         (((pIVar39->IO).KeyCtrl != true || ((pIVar39->IO).FontAllowUserScaling != true)))) {
        if ((pIVar39->IO).KeyCtrl == false) {
          if (((pIVar39->IO).KeyShift != true) ||
             (fVar72 = fVar62, fVar64 = 0.0, (pIVar39->IO).ConfigMacOSXBehaviors != false)) {
            fVar72 = fVar65;
            fVar64 = fVar62;
          }
          if ((fVar64 != 0.0) || (NAN(fVar64))) {
            if (GImGui->WheelingWindow != pIVar41) {
              GImGui->WheelingWindow = pIVar41;
              pIVar33->WheelingWindowRefMousePos = (pIVar33->IO).MousePos;
              pIVar33->WheelingWindowTimer = 2.0;
            }
            uVar43 = pIVar41->Flags;
            while (((uVar43 >> 0x18 & 1) != 0 &&
                   (((uVar43 & 0x210) == 0x10 ||
                    ((fVar62 = (pIVar41->ScrollMax).y, fVar62 == 0.0 && (!NAN(fVar62)))))))) {
              pIVar41 = pIVar41->ParentWindow;
              uVar43 = pIVar41->Flags;
            }
            if ((uVar43 & 0x210) == 0) {
              fVar62 = ((pIVar41->InnerRect).Max.y - (pIVar41->InnerRect).Min.y) * 0.67;
              fVar65 = pIVar33->FontBaseSize * pIVar41->FontWindowScale;
              if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
                fVar65 = fVar65 * pIVar41->ParentWindow->FontWindowScale;
              }
              fVar66 = fVar65 * 5.0;
              if (fVar62 <= fVar65 * 5.0) {
                fVar66 = fVar62;
              }
              (pIVar41->ScrollTarget).y = (pIVar41->Scroll).y - fVar64 * (float)(int)fVar66;
              (pIVar41->ScrollTargetCenterRatio).y = 0.0;
              (pIVar41->ScrollTargetEdgeSnapDist).y = 0.0;
            }
          }
          pIVar39 = GImGui;
          if ((fVar72 != 0.0) || (NAN(fVar72))) {
            if (GImGui->WheelingWindow != pIVar41) {
              GImGui->WheelingWindow = pIVar41;
              pIVar39->WheelingWindowRefMousePos = (pIVar39->IO).MousePos;
              pIVar39->WheelingWindowTimer = 2.0;
            }
            uVar43 = pIVar41->Flags;
            while (((uVar43 >> 0x18 & 1) != 0 &&
                   (((uVar43 & 0x210) == 0x10 ||
                    ((fVar62 = (pIVar41->ScrollMax).x, fVar62 == 0.0 && (!NAN(fVar62)))))))) {
              pIVar41 = pIVar41->ParentWindow;
              uVar43 = pIVar41->Flags;
            }
            if ((uVar43 & 0x210) == 0) {
              fVar62 = ((pIVar41->InnerRect).Max.x - (pIVar41->InnerRect).Min.x) * 0.67;
              fVar65 = pIVar39->FontBaseSize * pIVar41->FontWindowScale;
              if (pIVar41->ParentWindow != (ImGuiWindow *)0x0) {
                fVar65 = fVar65 * pIVar41->ParentWindow->FontWindowScale;
              }
              fVar64 = fVar65 + fVar65;
              if (fVar62 <= fVar65 + fVar65) {
                fVar64 = fVar62;
              }
              (pIVar41->ScrollTarget).x = (pIVar41->Scroll).x - fVar72 * (float)(int)fVar64;
              (pIVar41->ScrollTargetCenterRatio).x = 0.0;
              (pIVar41->ScrollTargetEdgeSnapDist).x = 0.0;
            }
          }
        }
      }
      else {
        if (GImGui->WheelingWindow != pIVar41) {
          GImGui->WheelingWindow = pIVar41;
          pIVar33->WheelingWindowRefMousePos = (pIVar33->IO).MousePos;
          pIVar33->WheelingWindowTimer = 2.0;
        }
        fVar62 = pIVar41->FontWindowScale;
        fVar72 = (pIVar39->IO).MouseWheel * 0.1 + fVar62;
        fVar65 = 2.5;
        if (fVar72 <= 2.5) {
          fVar65 = fVar72;
        }
        fVar65 = (float)(-(uint)(fVar72 < 0.5) & 0x3f000000 | ~-(uint)(fVar72 < 0.5) & (uint)fVar65)
        ;
        pIVar41->FontWindowScale = fVar65;
        if (pIVar41 == pIVar41->RootWindow) {
          local_88 = fVar65 / fVar62;
          uStack_84 = 0;
          uStack_80 = 0;
          uStack_7c = 0;
          fVar62 = (pIVar41->Size).x;
          fVar65 = (pIVar41->Size).y;
          fVar72 = (pIVar41->Pos).x;
          fVar64 = (pIVar41->Pos).y;
          local_98.Min.y =
               (((pIVar39->IO).MousePos.y - fVar64) * (1.0 - local_88) * fVar65) / fVar65 + fVar64;
          local_98.Min.x =
               (((pIVar39->IO).MousePos.x - fVar72) * (1.0 - local_88) * fVar62) / fVar62 + fVar72;
          SetWindowPos(pIVar41,&local_98.Min,0);
          IVar26.y = (float)(int)((pIVar41->Size).y * local_88);
          IVar26.x = (float)(int)((pIVar41->Size).x * local_88);
          pIVar41->Size = IVar26;
          IVar27.y = (float)(int)(local_88 * (pIVar41->SizeFull).y);
          IVar27.x = (float)(int)((pIVar41->SizeFull).x * local_88);
          pIVar41->SizeFull = IVar27;
        }
      }
    }
  }
  if ((pIVar31->Windows).Size < (pIVar31->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x115d,"void ImGui::NewFrame()");
  }
  local_88 = 3.4028235e+38;
  if ((pIVar31->GcCompactAll == false) &&
     (fVar62 = (pIVar31->IO).ConfigMemoryCompactTimer, 0.0 <= fVar62)) {
    local_88 = (float)pIVar31->Time - fVar62;
  }
  uVar43 = (pIVar31->Windows).Size;
  uVar44 = (ulong)uVar43;
  if (uVar43 != 0) {
    uVar59 = 0;
    do {
      if ((long)(int)uVar44 <= (long)uVar59) {
        pcVar45 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00133048;
      }
      pIVar41 = (pIVar31->Windows).Data[uVar59];
      bVar60 = pIVar41->Active;
      pIVar41->WasActive = bVar60;
      pIVar41->BeginCount = 0;
      pIVar41->Active = false;
      pIVar41->WriteAccessed = false;
      if (((bVar60 == false) && (pIVar41->MemoryCompacted == false)) &&
         (pIVar41->LastTimeActive <= local_88 && local_88 != pIVar41->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar41);
      }
      uVar59 = uVar59 + 1;
      uVar44 = (ulong)(uint)(pIVar31->Windows).Size;
    } while (uVar59 != uVar44);
  }
  if (0 < (pIVar31->TablesLastTimeActive).Size) {
    lVar56 = 0;
    lVar58 = 0;
    do {
      fVar62 = (pIVar31->TablesLastTimeActive).Data[lVar58];
      if ((0.0 <= fVar62) && (fVar62 < local_88)) {
        if ((pIVar31->Tables).Buf.Size <= lVar58) {
          pcVar45 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_00133048;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar31->Tables).Buf.Data)->ID + lVar56));
      }
      lVar58 = lVar58 + 1;
      lVar56 = lVar56 + 0x218;
    } while (lVar58 < (pIVar31->TablesLastTimeActive).Size);
  }
  if (0 < (pIVar31->TablesTempData).Size) {
    lVar56 = 0;
    lVar58 = 0;
    do {
      pIVar16 = (pIVar31->TablesTempData).Data;
      fVar62 = *(float *)((long)&pIVar16->LastTimeActive + lVar56);
      if ((0.0 <= fVar62) && (fVar62 < local_88)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar16->TableIndex + lVar56));
      }
      lVar58 = lVar58 + 1;
      lVar56 = lVar56 + 0x70;
    } while (lVar58 < (pIVar31->TablesTempData).Size);
  }
  if (pIVar31->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar31->GcCompactAll = false;
  if ((pIVar31->NavWindow != (ImGuiWindow *)0x0) && (pIVar31->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar48 = (pIVar31->CurrentWindowStack).Capacity;
  if (iVar48 < 0) {
    uVar43 = iVar48 / 2 + iVar48;
    uVar44 = 0;
    if (0 < (int)uVar43) {
      uVar44 = (ulong)uVar43;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(uVar44 * 0x58,GImAllocatorUserData);
    pIVar17 = (pIVar31->CurrentWindowStack).Data;
    if (pIVar17 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest,pIVar17,(long)(pIVar31->CurrentWindowStack).Size * 0x58);
      pIVar17 = (pIVar31->CurrentWindowStack).Data;
      if ((pIVar17 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
    }
    (pIVar31->CurrentWindowStack).Data = __dest;
    (pIVar31->CurrentWindowStack).Capacity = (int)uVar44;
  }
  (pIVar31->CurrentWindowStack).Size = 0;
  iVar48 = (pIVar31->BeginPopupStack).Capacity;
  if (iVar48 < 0) {
    uVar43 = iVar48 / 2 + iVar48;
    uVar44 = 0;
    if (0 < (int)uVar43) {
      uVar44 = (ulong)uVar43;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar44 * 0x38,GImAllocatorUserData);
    pIVar18 = (pIVar31->BeginPopupStack).Data;
    if (pIVar18 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar18,(long)(pIVar31->BeginPopupStack).Size * 0x38);
      pIVar18 = (pIVar31->BeginPopupStack).Data;
      if ((pIVar18 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar31->BeginPopupStack).Data = __dest_00;
    (pIVar31->BeginPopupStack).Capacity = (int)uVar44;
  }
  (pIVar31->BeginPopupStack).Size = 0;
  iVar48 = (pIVar31->ItemFlagsStack).Capacity;
  if (iVar48 < 0) {
    uVar43 = iVar48 / 2 + iVar48;
    uVar44 = 0;
    if (0 < (int)uVar43) {
      uVar44 = (ulong)uVar43;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    piVar42 = (int *)(*GImAllocatorAllocFunc)(uVar44 * 4,GImAllocatorUserData);
    piVar19 = (pIVar31->ItemFlagsStack).Data;
    if (piVar19 != (int *)0x0) {
      memcpy(piVar42,piVar19,(long)(pIVar31->ItemFlagsStack).Size << 2);
      piVar19 = (pIVar31->ItemFlagsStack).Data;
      if ((piVar19 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar19,GImAllocatorUserData);
    }
    (pIVar31->ItemFlagsStack).Data = piVar42;
    (pIVar31->ItemFlagsStack).Capacity = (int)uVar44;
  }
  (pIVar31->ItemFlagsStack).Size = 0;
  if ((pIVar31->ItemFlagsStack).Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    piVar42 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
    piVar19 = (pIVar31->ItemFlagsStack).Data;
    if (piVar19 != (int *)0x0) {
      memcpy(piVar42,piVar19,(long)(pIVar31->ItemFlagsStack).Size << 2);
      piVar19 = (pIVar31->ItemFlagsStack).Data;
      if ((piVar19 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar19,GImAllocatorUserData);
    }
    (pIVar31->ItemFlagsStack).Data = piVar42;
    (pIVar31->ItemFlagsStack).Capacity = 8;
  }
  (pIVar31->ItemFlagsStack).Data[(pIVar31->ItemFlagsStack).Size] = 0;
  (pIVar31->ItemFlagsStack).Size = (pIVar31->ItemFlagsStack).Size + 1;
  iVar48 = (pIVar31->GroupStack).Capacity;
  if (iVar48 < 0) {
    uVar43 = iVar48 / 2 + iVar48;
    uVar44 = 0;
    if (0 < (int)uVar43) {
      uVar44 = (ulong)uVar43;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar19 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar19 = *piVar19 + 1;
    }
    __dest_01 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar44 * 0x30,GImAllocatorUserData);
    pIVar20 = (pIVar31->GroupStack).Data;
    if (pIVar20 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_01,pIVar20,(long)(pIVar31->GroupStack).Size * 0x30);
      pIVar20 = (pIVar31->GroupStack).Data;
      if ((pIVar20 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar19 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar19 = *piVar19 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
    }
    (pIVar31->GroupStack).Data = __dest_01;
    (pIVar31->GroupStack).Capacity = (int)uVar44;
  }
  (pIVar31->GroupStack).Size = 0;
  pIVar39 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar39->DebugItemPickerActive == true) {
    uVar43 = pIVar39->HoveredIdPreviousFrame;
    pIVar39->MouseCursor = 7;
    bVar60 = IsKeyPressed(0x20e,true);
    if (bVar60) {
      pIVar39->DebugItemPickerActive = false;
    }
    pIVar33 = GImGui;
    if (uVar43 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar39->DebugItemPickerBreakId = uVar43;
      pIVar39->DebugItemPickerActive = false;
    }
    pIVar6 = &pIVar33->NextWindowData;
    *(byte *)&pIVar6->Flags = (byte)pIVar6->Flags | 0x40;
    (pIVar33->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar43);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar43 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar39 = GImGui;
  GImGui->DebugHookIdInfo = 0;
  if (pIVar39->FrameCount == (pIVar39->DebugStackTool).LastActiveFrame + 1) {
    IVar49 = pIVar39->HoveredIdPreviousFrame;
    if (IVar49 == 0) {
      IVar49 = pIVar39->ActiveId;
    }
    if ((pIVar39->DebugStackTool).QueryId != IVar49) {
      (pIVar39->DebugStackTool).QueryId = IVar49;
      (pIVar39->DebugStackTool).StackLevel = -1;
      iVar48 = (pIVar39->DebugStackTool).Results.Capacity;
      if (iVar48 < 0) {
        uVar43 = iVar48 / 2 + iVar48;
        uVar44 = 0;
        if (0 < (int)uVar43) {
          uVar44 = (ulong)uVar43;
        }
        if (pIVar39 != (ImGuiContext *)0x0) {
          piVar19 = &(pIVar39->IO).MetricsActiveAllocations;
          *piVar19 = *piVar19 + 1;
        }
        __dest_02 = (ImGuiStackLevelInfo *)
                    (*GImAllocatorAllocFunc)(uVar44 << 6,GImAllocatorUserData);
        pIVar21 = (pIVar39->DebugStackTool).Results.Data;
        if (pIVar21 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_02,pIVar21,(long)(pIVar39->DebugStackTool).Results.Size << 6);
          pIVar21 = (pIVar39->DebugStackTool).Results.Data;
          if ((pIVar21 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar19 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar19 = *piVar19 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
        }
        (pIVar39->DebugStackTool).Results.Data = __dest_02;
        (pIVar39->DebugStackTool).Results.Capacity = (int)uVar44;
      }
      (pIVar39->DebugStackTool).Results.Size = 0;
    }
    if (IVar49 != 0) {
      iVar48 = (pIVar39->DebugStackTool).StackLevel;
      lVar56 = (long)iVar48;
      if (((-1 < lVar56) && (iVar48 < (pIVar39->DebugStackTool).Results.Size)) &&
         ((pIVar21 = (pIVar39->DebugStackTool).Results.Data, pIVar21[lVar56].QuerySuccess != false
          || ('\x02' < pIVar21[lVar56].QueryFrameCount)))) {
        (pIVar39->DebugStackTool).StackLevel = iVar48 + 1;
      }
      uVar43 = (pIVar39->DebugStackTool).StackLevel;
      uVar44 = (ulong)uVar43;
      if (uVar44 == 0xffffffff) {
        pIVar39->DebugHookIdInfo = IVar49;
      }
      if ((-1 < (int)uVar43) && ((int)uVar43 < (pIVar39->DebugStackTool).Results.Size)) {
        pIVar21 = (pIVar39->DebugStackTool).Results.Data;
        pIVar39->DebugHookIdInfo = pIVar21[uVar44].ID;
        pIVar7 = &pIVar21[uVar44].QueryFrameCount;
        *pIVar7 = *pIVar7 + '\x01';
      }
    }
  }
  pIVar31->WithinFrameScopeWithImplicitWindow = true;
  pIVar39 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar39->NextWindowData).SizeVal.x = 400.0;
  (pIVar39->NextWindowData).SizeVal.y = 400.0;
  (pIVar39->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar31->CurrentWindow->IsFallbackWindow == false) {
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x118d,"void ImGui::NewFrame()");
  }
  if (0 < (pIVar31->Hooks).Size) {
    lVar56 = 0;
    lVar58 = 0;
    do {
      pIVar11 = (pIVar31->Hooks).Data;
      if (*(int *)(pIVar11 + lVar56 + 4) == 1) {
        (**(code **)(pIVar11 + lVar56 + 0x10))(pIVar31,pIVar11 + lVar56);
      }
      lVar58 = lVar58 + 1;
      lVar56 = lVar56 + 0x20;
    } while (lVar58 < (pIVar31->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Clear ActiveID if the item is not alive anymore.
    // In 1.87, the common most call to KeepAliveID() was moved from GetID() to ItemAdd().
    // As a result, custom widget using ButtonBehavior() _without_ ItemAdd() need to call KeepAliveID() themselves.
    if (g.ActiveId != 0 && g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("NewFrame(): ClearActiveID() because it isn't marked alive anymore!\n");
        ClearActiveID();
    }

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}